

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# toms462.cpp
# Opt level: O3

double bivnor(double ah,double ak,double r)

{
  byte bVar1;
  byte bVar2;
  ulong uVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  double local_48;
  double local_30;
  double local_28;
  
  dVar4 = erf(ah / -1.4142135623730951);
  dVar4 = (dVar4 + 1.0) * 0.5 * 0.5;
  dVar5 = erf(ak / -1.4142135623730951);
  dVar5 = (dVar5 + 1.0) * 0.5 * 0.5;
  if ((r == 0.0) && (!NAN(r))) {
    local_28 = dVar4 * 4.0 * dVar5;
    goto LAB_001d4374;
  }
  dVar6 = (1.0 - r) * (r + 1.0);
  if (dVar6 < 0.0) {
    std::operator<<((ostream *)&std::cerr,"\n");
    std::operator<<((ostream *)&std::cerr,"BIVNOR - Fatal error!\n");
    std::operator<<((ostream *)&std::cerr,"  1 < |R|.\n");
    exit(0);
  }
  if ((dVar6 == 0.0) && (!NAN(dVar6))) {
    if (0.0 <= r) {
      if (ak <= ah) {
        local_28 = dVar4 + dVar4;
      }
      else {
        local_28 = dVar5 + dVar5;
      }
    }
    else {
      local_28 = 0.0;
      if (ah + ak < 0.0) {
        local_28 = dVar4 + dVar5 + dVar4 + dVar5 + -1.0;
      }
    }
    goto LAB_001d4374;
  }
  if (dVar6 < 0.0) {
    dVar6 = sqrt(dVar6);
  }
  else {
    dVar6 = SQRT(dVar6);
  }
  if ((((ah == 0.0) && (!NAN(ah))) && (ak == 0.0)) && (!NAN(ak))) {
    dVar4 = asin(r);
    local_28 = dVar4 / 6.283185307179587 + 0.25;
    goto LAB_001d4374;
  }
  if (((ah != 0.0) || (NAN(ah))) || ((ak == 0.0 && (!NAN(ak))))) {
    dVar14 = 0.0;
    if (((ah == 0.0) && (!NAN(ah))) || ((ak != 0.0 || (local_28 = dVar4, NAN(ak))))) {
      bVar2 = 1;
      if ((ah != 0.0) || (NAN(ah))) {
        local_28 = 0.0;
        dVar12 = 0.0;
        local_48 = 0.0;
        if ((ak != 0.0) || (NAN(ak))) {
          uVar3 = -(ulong)(ah * ak < 0.0);
          local_28 = (double)(~uVar3 & (ulong)(dVar4 + dVar5) |
                             (ulong)(dVar4 + dVar5 + -0.5) & uVar3);
          goto LAB_001d45ae;
        }
      }
      else {
        local_28 = 0.0;
        dVar12 = 0.0;
        local_48 = 0.0;
      }
    }
    else {
LAB_001d45ae:
      dVar14 = dVar4 + dVar4;
      bVar2 = 0;
      local_48 = (ak / ah - r) / dVar6;
      dVar12 = -ah;
    }
  }
  else {
    local_48 = (ah / ak - r) / dVar6;
    dVar14 = dVar5 + dVar5;
    bVar2 = 1;
    dVar12 = -ak;
    local_28 = dVar5;
  }
  do {
    if ((local_48 != 0.0) || (NAN(local_48))) {
      uVar3 = -(ulong)(local_48 < -local_48);
      dVar4 = (double)(~uVar3 & (ulong)local_48 | (ulong)-local_48 & uVar3);
      if ((dVar4 != 1.0) || (NAN(dVar4))) {
        if (dVar4 <= 1.0) {
          local_30 = -1.0;
        }
        else {
          dVar12 = dVar12 * local_48;
          dVar4 = erf(dVar12 / 1.4142135623730951);
          local_48 = 1.0 / local_48;
          dVar4 = (dVar4 + 1.0) * 0.5;
          local_28 = dVar4 * dVar14 +
                     ((double)(~-(ulong)(local_48 < 0.0) & (ulong)local_28 |
                              (ulong)(local_28 + 0.5) & -(ulong)(local_48 < 0.0)) -
                     (dVar14 + dVar4) * 0.5);
          local_30 = 1.0;
        }
        dVar12 = dVar12 * dVar12 * 0.5;
        dVar4 = exp(-dVar12);
        dVar13 = 1.0 - dVar4;
        dVar14 = 3.1415926535897937e-15 / local_48;
        uVar3 = -(ulong)(dVar14 < -dVar14);
        dVar14 = (double)(~uVar3 & (ulong)dVar14 | (ulong)-dVar14 & uVar3);
        uVar3 = -(ulong)(dVar13 < -dVar13);
        if (dVar14 < (double)(~uVar3 & (ulong)dVar13 | (ulong)-dVar13 & uVar3)) {
          dVar4 = dVar4 * dVar12;
          dVar8 = 1.0;
          dVar10 = 1.0;
          dVar7 = dVar13;
          do {
            dVar9 = dVar10 + 1.0;
            dVar7 = dVar7 - dVar4;
            dVar4 = (dVar4 * dVar12) / dVar9;
            dVar8 = -dVar8 * local_48 * local_48;
            dVar11 = (dVar8 * dVar7) / (dVar10 + dVar9);
            dVar13 = dVar13 + dVar11;
            uVar3 = -(ulong)(dVar11 < -dVar11);
            dVar10 = dVar9;
          } while (dVar14 < (double)(~uVar3 & (ulong)dVar11 | (ulong)-dVar11 & uVar3));
        }
        dVar4 = atan(local_48);
        local_28 = local_28 + local_30 * ((dVar4 - dVar13 * local_48) / 6.283185307179587);
      }
      else {
        local_28 = local_28 + (1.0 - dVar14) * local_48 * dVar14 * -0.5;
      }
    }
    bVar1 = bVar2 ^ 1;
    bVar2 = 1;
    dVar12 = -ak;
    dVar14 = dVar5 + dVar5;
    local_48 = (ah / ak - r) / dVar6;
  } while ((bool)(ak != 0.0 & bVar1));
LAB_001d4374:
  if (local_28 <= 0.0) {
    local_28 = 0.0;
  }
  dVar4 = r8_min(local_28,1.0);
  return dVar4;
}

Assistant:

double bivnor ( double ah, double ak, double r )

//****************************************************************************80
//
//  Purpose:
//
//    BIVNOR computes the bivariate normal CDF.
//
//  Discussion:
//
//    BIVNOR computes the probability for two normal variates X and Y
//    whose correlation is R, that AH <= X and AK <= Y.
//
//  Licensing:
//
//    This code is distributed under the GNU LGPL license.
//
//  Modified:
//
//    13 April 2012
//
//  Author:
//
//    Original FORTRAN77 version by Thomas Donnelly.
//    C++ version by John Burkardt.
//
//  Reference:
//
//    Thomas Donnelly,
//    Algorithm 462: Bivariate Normal Distribution,
//    Communications of the ACM,
//    October 1973, Volume 16, Number 10, page 638.
//
//  Parameters:
//
//    Input, double AH, AK, the lower limits of integration.
//
//    Input, double R, the correlation between X and Y.
//
//    Output, double BIVNOR, the bivariate normal CDF.
//
//  Local Parameters:
//
//    Local, int IDIG, the number of significant digits
//    to the right of the decimal point desired in the answer.
//
{
  double a2;
  double ap;
  double b;
  double cn;
  double con;
  double conex;
  double ex;
  double g2;
  double gh;
  double gk;
  double gw = 0.0; // Silence uninitialized warning.
  double h2;
  double h4;
  int i;
  static int idig = 15;
  int is = 0; // Silence uninitialized warning.
  double rr;
  double s1;
  double s2;
  double sgn;
  double sn;
  double sp;
  double sqr;
  double t;
  static double twopi = 6.283185307179587;
  double w2;
  double wh = 0.0; // Silence uninitialized warning.
  double wk = 0.0; // Silence uninitialized warning.

  b = 0.0;

  gh = gauss ( - ah ) / 2.0;
  gk = gauss ( - ak ) / 2.0;

  if ( r == 0.0 )
  {
    b = 4.00 * gh * gk;
    b = r8_max ( b, 0.0 );
    b = r8_min ( b, 1.0 );
    return b;
  }

  rr = ( 1.0 + r ) * ( 1.0 - r );

  if ( rr < 0.0 )
  {
    std::cerr << "\n";
    std::cerr << "BIVNOR - Fatal error!\n";
    std::cerr << "  1 < |R|.\n";
    exit ( 0 );
  }

  if ( rr == 0.0 )
  {
    if ( r < 0.0 )
    {
      if ( ah + ak < 0.0 )
      {
        b = 2.0 * ( gh + gk ) - 1.0;
      }
    }
    else
    {
      if ( ah - ak < 0.0 )
      {
        b = 2.0 * gk;
      }
      else
      {
        b = 2.0 * gh;
      }
    }
    b = r8_max ( b, 0.0 );
    b = r8_min ( b, 1.0 );
    return b;
  }

  sqr = sqrt ( rr );

  if ( idig == 15 )
  {
    con = twopi * 1.0E-15 / 2.0;
  }
  else
  {
    con = twopi / 2.0;
    for ( i = 1; i <= idig; i++ )
    {
      con = con / 10.0;
    }
  }
//
//  (0,0)
//
  if ( ah == 0.0 && ak == 0.0 )
  {
    b = 0.25 + asin ( r ) / twopi;
    b = r8_max ( b, 0.0 );
    b = r8_min ( b, 1.0 );
    return b;
  }
//
//  (0,nonzero)
//
  if ( ah == 0.0 && ak != 0.0 )
  {
    b = gk;
    wh = -ak;
    wk = ( ah / ak - r ) / sqr;
    gw = 2.0 * gk;
    is = 1;
  }
//
//  (nonzero,0)
//
  else if ( ah != 0.0 && ak == 0.0 )
  {
    b = gh;
    wh = -ah;
    wk = ( ak / ah - r ) / sqr;
    gw = 2.0 * gh;
    is = -1;
  }
//
//  (nonzero,nonzero)
//
  else if ( ah != 0.0 && ak != 0.0 )
  {
    b = gh + gk;
    if ( ah * ak < 0.0 )
    {
      b = b - 0.5;
    }
    wh = - ah;
    wk = ( ak / ah - r ) / sqr;
    gw = 2.0 * gh;
    is = -1;
  }

  for ( ; ; )
  {
    sgn = -1.0;
    t = 0.0;

    if ( wk != 0.0 )
    {
      if ( r8_abs ( wk ) == 1.0 )
      {
        t = wk * gw * ( 1.0 - gw ) / 2.0;
        b = b + sgn * t;
      }
      else
      {
        if ( 1.0 < r8_abs ( wk ) )
        {
          sgn = -sgn;
          wh = wh * wk;
          g2 = gauss ( wh );
          wk = 1.0 / wk;

          if ( wk < 0.0 )
          {
            b = b + 0.5;
          }
          b = b - ( gw + g2 ) / 2.0 + gw * g2;
        }
        h2 = wh * wh;
        a2 = wk * wk;
        h4 = h2 / 2.0;
        ex = exp ( - h4 );
        w2 = h4 * ex;
        ap = 1.0;
        s2 = ap - ex;
        sp = ap;
        s1 = 0.0;
        sn = s1;
        conex = r8_abs ( con / wk );

        for ( ; ; )
        {
          cn = ap * s2 / ( sn + sp );
          s1 = s1 + cn;

          if ( r8_abs ( cn ) <= conex )
          {
            break;
          }
          sn = sp;
          sp = sp + 1.0;
          s2 = s2 - w2;
          w2 = w2 * h4 / sp;
          ap = - ap * a2;
        }
        t = ( atan ( wk ) - wk * s1 ) / twopi;
        b = b + sgn * t;
      }
    }
    if ( 0 <= is )
    {
      break;
    }
    if ( ak == 0.0 )
    {
      break;
    }
    wh = -ak;
    wk = ( ah / ak - r ) / sqr;
    gw = 2.0 * gk;
    is = 1;
  }

  b = r8_max ( b, 0.0 );
  b = r8_min ( b, 1.0 );

  return b;
}